

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apu.cpp
# Opt level: O1

void __thiscall trackerboy::apu::Sequencer::run(Sequencer *this,Hardware *hw,uint32_t cycles)

{
  long lVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  
  bVar3 = Timer::run(&this->mTimer,cycles);
  if (!bVar3) {
    return;
  }
  lVar1 = (ulong)this->mTriggerIndex * 0xc;
  iVar2 = *(int *)(TRIGGER_SEQUENCE + lVar1 + 8);
  if (iVar2 == 0) {
    Sweep::clock(&hw->mSweep);
  }
  else if (iVar2 != 1) {
    if (iVar2 == 2) {
      lVar4 = 0;
      do {
        Envelope::clock((Envelope *)(&(hw->mEnvelopes)._M_elems[0].mRegister + lVar4));
        lVar4 = lVar4 + 5;
      } while (lVar4 != 0xf);
    }
    goto LAB_00188d43;
  }
  Hardware::clockLengthCounters(hw);
LAB_00188d43:
  *(ulong *)&(this->mTimer).mPeriod =
       *(ulong *)(TRIGGER_SEQUENCE + lVar1) << 0x20 | *(ulong *)(TRIGGER_SEQUENCE + lVar1) >> 0x20;
  return;
}

Assistant:

void Sequencer::run(Hardware &hw, uint32_t cycles) noexcept {
    if (mTimer.run(cycles)) {
        Trigger const &trigger = TRIGGER_SEQUENCE[mTriggerIndex];
        switch (trigger.type) {
            case TriggerType::lcSweep:
                hw.clockSweep();
                [[fallthrough]];
            case TriggerType::lc:
                hw.clockLengthCounters();
                break;
            case TriggerType::env:
                hw.clockEnvelopes();
                break;
        }
        mTimer.setPeriod(trigger.nextPeriod);
        mTriggerIndex = trigger.nextIndex;
    }
}